

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O1

void __thiscall wavingz::demod::demod_nrz::operator()(demod_nrz *this,complex<double> iq)

{
  bool bVar1;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  optional<bool> sample;
  optional<bool> local_3a;
  double local_38;
  double local_28;
  double local_20;
  double local_18;
  
  local_18 = in_XMM1_Qa;
  local_38 = iir_filter<6>::operator()(&this->lp1,in_XMM0_Qa);
  local_18 = iir_filter<6>::operator()(&this->lp2,local_18);
  local_20 = local_38;
  local_38 = atan_fm_demodulator::operator()(&this->fsk_demod,(complex<double> *)&local_20);
  local_28 = iir_filter<3>::operator()(&this->freq_filter,local_38);
  local_38 = iir_filter<3>::operator()(&this->lock_filter,local_38);
  local_3a.super_type.m_initialized = false;
  if (0.01 < ABS(local_38)) {
    bVar1 = state_machine::sample_sm_t::idle(&this->samples_sm);
    if (bVar1) {
      this->omega_c = local_38;
    }
    local_3a.super_type.m_storage = local_28 < this->omega_c;
    local_3a.super_type.m_initialized = true;
    bVar1 = state_machine::sample_sm_t::preamble(&this->samples_sm);
    if (bVar1) {
      this->omega_c = this->omega_c * 0.95 + local_38 * 0.05;
    }
  }
  state_machine::sample_sm_t::process(&this->samples_sm,&local_3a);
  return;
}

Assistant:

void operator()(std::complex<double> iq)
    {
        iq = std::complex<double>(lp1(iq.real()), lp2(iq.imag()));
        double f = fsk_demod(iq);
        double s = freq_filter(f);
        double lock_freq = lock_filter(f);
        boost::optional<bool> sample;

        // check for signal, adjust central freq, and get sample
        bool signal = std::abs(lock_freq) > 0.01;
        if(signal)
        {
            if (samples_sm.idle()) omega_c = lock_freq;
            sample = (s - omega_c) < 0.0;
            if (samples_sm.preamble()) omega_c = 0.95 * omega_c + lock_freq * 0.05;
        }
        // process the sample with the state machine
        samples_sm.process(sample);
    }